

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int StopThreadNMEADevicex(NMEADEVICE *pNMEADevice)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = NMEADeviceCS;
  lVar1 = 0;
  do {
    if (*(NMEADEVICE **)((long)addrsNMEADevice + lVar1 * 2) == pNMEADevice) {
      *(undefined4 *)((long)bExitNMEADevice + lVar1) = 1;
      pthread_join(*(pthread_t *)((long)NMEADeviceThreadId + lVar1 * 2),(void **)0x0);
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resNMEADevice + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadNMEADevicex(NMEADEVICE* pNMEADevice)
{
	int id = 0;

	while (addrsNMEADevice[id] != pNMEADevice)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitNMEADevice[id] = TRUE;
	WaitForThread(NMEADeviceThreadId[id]);
	DeleteCriticalSection(&NMEADeviceCS[id]);
	resNMEADevice[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}